

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlgorithmBase.cpp
# Opt level: O0

void __thiscall AlgorithmBase::AlgorithmBase(AlgorithmBase *this,QObject *parent)

{
  Object local_30 [24];
  QObject *local_18;
  QObject *parent_local;
  AlgorithmBase *this_local;
  
  local_18 = parent;
  parent_local = (QObject *)this;
  QThread::QThread(&this->super_QThread,parent);
  *(undefined ***)this = &PTR_metaObject_0036bfb8;
  QImage::QImage(&this->target_);
  QImage::QImage(&this->allRgb_);
  this->iterations_ = 0;
  this->improvements_ = 0;
  QTimer::QTimer(&this->iterateTimer_,(QObject *)this);
  QTimer::setSingleShot((bool)((char)this + 'P'));
  QTimer::setInterval((ConnectionType)this + 0x50);
  QObject::connect<void(QTimer::*)(QTimer::QPrivateSignal),void(AlgorithmBase::*)()>
            (local_30,(offset_in_QTimer_to_subr)&this->iterateTimer_,(Object *)QTimer::timeout,0,
             (ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  return;
}

Assistant:

AlgorithmBase::AlgorithmBase(QObject *parent)
    : QThread{parent}
    , iterations_(0)
    , improvements_(0)
    , iterateTimer_(this)
{
    iterateTimer_.setSingleShot(false);
    iterateTimer_.setInterval(0);
    connect(&iterateTimer_, &QTimer::timeout, this, &AlgorithmBase::Iterate, Qt::DirectConnection);
}